

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O0

int ncnn::deconvolutiondepthwise
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,int group,
              int activation_type,Mat *activation_params,Option *opt)

{
  int iVar1;
  float *pfVar2;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined4 *puVar3;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar4;
  float fVar5;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  long *in_stack_00000038;
  int i_6;
  int size_3;
  float *outptr_3;
  int k_1;
  float val_1;
  int q;
  float *kptr_1;
  float *outptr_2;
  int j_2;
  int i_5;
  int outh_1;
  int outw_2;
  int h_1;
  int w_2;
  float bias_1;
  float *weight_data_ptr;
  Mat out_1;
  int p;
  int g_1;
  int outch_g;
  int inch_g;
  int i_3;
  int size_1;
  float *outptr_1;
  float w_1;
  int k;
  float val;
  float *outptr;
  int j_1;
  int i_2;
  int outh;
  int outw_1;
  int h;
  int w;
  float bias;
  Mat out;
  float *kptr;
  float *inptr;
  int g;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outw;
  int inch;
  Mat *m_3;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  int i_4;
  float *ptr_1;
  int size_2;
  int i_1;
  float *ptr;
  int size;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  float local_894;
  allocator_type *in_stack_fffffffffffff770;
  size_type in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff784;
  undefined4 local_840;
  float local_7f4;
  undefined4 local_7d0;
  int local_760;
  int local_74c;
  undefined8 local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined4 local_730;
  long local_728;
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined8 local_708;
  float local_700;
  int local_6fc;
  long local_6f8;
  long local_6f0;
  int local_6e4;
  int local_6e0;
  int local_6dc;
  int local_6d8;
  int local_6d4;
  int local_6d0;
  undefined4 local_6cc;
  long local_6c8;
  undefined4 *local_6c0;
  int *local_6b8;
  ulong local_6b0;
  undefined4 local_6a8;
  long *local_6a0;
  int local_698;
  int local_694;
  int local_690;
  undefined4 local_68c;
  int local_688;
  ulong local_680;
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  int local_668;
  int local_664;
  undefined4 *local_660;
  float local_654;
  int local_650;
  float local_64c;
  long local_648;
  int local_63c;
  int local_638;
  int local_634;
  int local_630;
  int local_62c;
  int local_628;
  undefined4 local_624;
  undefined4 *local_620;
  int *local_618;
  ulong local_610;
  undefined4 local_608;
  long *local_600;
  int local_5f8;
  int local_5f4;
  int local_5f0;
  undefined4 local_5ec;
  int local_5e8;
  ulong local_5e0;
  long local_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined4 local_5b8;
  long local_5b0;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  undefined8 local_590;
  long local_588;
  int local_580;
  int local_57c;
  int local_578;
  int local_574;
  int local_570;
  int local_56c;
  reference local_568;
  vector<int,_std::allocator<int>_> local_548;
  int local_530;
  int local_52c;
  int local_528;
  int local_524;
  int local_520;
  int local_51c;
  long *local_518;
  long *local_510;
  long *local_508;
  long *local_500;
  undefined8 *local_4f8;
  undefined4 **local_4e8;
  undefined8 *local_4d8;
  undefined4 **local_4c8;
  long *local_4b8;
  long *local_4b0;
  undefined4 **local_4a8;
  undefined4 **local_4a0;
  int local_488;
  undefined4 local_484;
  undefined4 **local_480;
  undefined8 *local_460;
  int local_448;
  undefined4 local_444;
  undefined4 **local_440;
  undefined8 *local_420;
  undefined4 *local_408;
  undefined4 *local_3e8;
  long *local_3d8;
  long *local_3d0;
  undefined1 local_3c5;
  int local_3c4;
  undefined8 *local_3b8;
  undefined1 local_38d;
  int local_38c;
  undefined8 *local_380;
  long *local_358;
  undefined8 *local_348;
  undefined1 local_33d;
  int local_33c;
  undefined4 **local_330;
  undefined1 local_305;
  int local_304;
  undefined4 **local_2f8;
  long local_2d0;
  long *local_2c8;
  long local_2c0;
  long *local_2b8;
  int local_2ac;
  undefined4 *local_2a8;
  int local_2a0;
  undefined4 local_29c;
  undefined4 **local_298;
  undefined4 **local_290;
  int local_284;
  undefined4 *local_280;
  int local_278;
  undefined4 local_274;
  undefined4 **local_270;
  undefined4 **local_268;
  int local_25c;
  undefined4 **local_258;
  int local_24c;
  undefined4 **local_248;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  long *local_218;
  float local_20c [3];
  long *local_200;
  undefined8 local_1f8;
  long *local_1f0;
  undefined8 local_1e8;
  long *local_1e0;
  undefined8 local_1d8;
  long *local_1d0;
  undefined8 local_1c8;
  long *local_1c0;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  long *local_190;
  float local_184 [3];
  long *local_178;
  undefined8 local_170;
  long *local_168;
  undefined8 local_160;
  long *local_158;
  undefined8 local_150;
  long *local_148;
  undefined8 local_140;
  long *local_138;
  int local_12c;
  undefined8 *local_128;
  long *local_120;
  undefined4 local_114;
  ulong local_110;
  undefined4 *local_108;
  int local_fc;
  int local_f8;
  int local_f4;
  undefined4 **local_f0;
  long *local_e8;
  undefined4 local_dc;
  ulong local_d8;
  undefined4 *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined4 **local_b8;
  long local_b0;
  undefined4 local_a4;
  long local_a0;
  long local_98;
  undefined4 local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  long local_78;
  undefined4 local_6c;
  long local_68;
  long local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_524 = (int)in_RDI[7];
  local_528 = *(int *)((long)in_RSI + 0x2c);
  local_52c = (int)in_RSI[7];
  local_530 = in_R8D * in_R9D;
  local_520 = in_R9D;
  local_51c = in_R8D;
  local_518 = in_RCX;
  local_510 = in_RDX;
  local_508 = in_RSI;
  local_500 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x15e8534);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),in_stack_fffffffffffff778
             ,in_stack_fffffffffffff770);
  std::allocator<int>::~allocator((allocator<int> *)0x15e8560);
  local_568 = std::vector<int,_std::allocator<int>_>::operator[](&local_548,0);
  local_56c = 0;
  local_570 = 0;
  local_574 = local_528 * in_stack_00000020 - local_51c * in_stack_00000018;
  for (local_578 = 0; local_578 < local_520; local_578 = local_578 + 1) {
    for (local_57c = 0; local_57c < local_51c; local_57c = local_57c + 1) {
      local_568[local_56c] = local_570;
      local_56c = local_56c + 1;
      local_570 = in_stack_00000018 + local_570;
    }
    local_570 = local_574 + local_570;
  }
  if ((local_524 == in_stack_00000028) && (in_stack_00000028 == local_52c)) {
    for (local_580 = 0; local_580 < in_stack_00000028; local_580 = local_580 + 1) {
      local_380 = &local_5d0;
      local_84 = *(int *)((long)local_500 + 0x2c);
      local_88 = (int)local_500[6];
      local_8c = *(undefined4 *)((long)local_500 + 0x34);
      local_588 = *local_500 + local_500[8] * (long)local_580 * local_500[2];
      local_a0 = local_500[2];
      local_a4 = (undefined4)local_500[3];
      local_b0 = local_500[4];
      local_80 = &local_5d0;
      local_28 = (long)local_84 * (long)local_88 * local_a0;
      local_348 = &local_5d0;
      local_4f8 = &local_5d0;
      local_2c = 0x10;
      local_38c = local_580;
      local_38d = 1;
      local_5d0 = 0;
      local_5c0 = 0;
      local_5b8 = 0;
      local_5a4 = 0;
      local_5a0 = 0;
      local_59c = 0;
      local_598 = 0;
      local_5c8 = 0;
      local_5d8 = *local_510 + (long)(local_530 * local_580) * 4;
      local_2f8 = &local_620;
      local_f4 = *(int *)((long)local_508 + 0x2c);
      local_f8 = (int)local_508[6];
      local_fc = *(int *)((long)local_508 + 0x34);
      local_660 = (undefined4 *)(*local_508 + local_508[8] * (long)local_580 * local_508[2]);
      local_110 = local_508[2];
      local_114 = (undefined4)local_508[3];
      local_120 = (long *)local_508[4];
      local_f0 = &local_620;
      local_618 = (int *)0x0;
      local_5ec = 1;
      local_8 = (long)local_f4 * (long)local_f8 * local_110;
      local_5e0 = (local_8 + 0xfU & 0xfffffffffffffff0) / local_110;
      local_5f8 = (int)local_508[5] + -1;
      if ((int)local_508[5] == 4) {
        local_5e0 = (long)*(int *)((long)local_508 + 0x2c) * (long)(int)local_508[6];
      }
      local_c = 0x10;
      local_304 = local_580;
      local_305 = 1;
      local_590 = 0;
      local_5a8 = 0;
      local_4b0 = local_518;
      bVar4 = true;
      if (*local_518 != 0) {
        local_3d8 = local_518;
        bVar4 = local_518[8] * (long)(int)local_518[7] == 0;
      }
      if (bVar4) {
        local_7d0 = 0;
      }
      else {
        local_2c0 = (long)local_580;
        local_2b8 = local_518;
        local_7d0 = *(undefined4 *)(*local_518 + local_2c0 * 4);
      }
      local_624 = local_7d0;
      local_270 = &local_620;
      local_274 = local_7d0;
      local_278 = (int)local_5e0 * local_fc;
      local_280 = local_660;
      for (local_284 = 0; local_284 < local_278; local_284 = local_284 + 1) {
        *local_280 = local_7d0;
        local_280 = local_280 + 1;
      }
      local_628 = *(int *)((long)local_500 + 0x2c);
      local_62c = (int)local_500[6];
      local_630 = *(int *)((long)local_508 + 0x2c);
      local_634 = (int)local_508[6];
      for (local_638 = 0; local_638 < local_62c; local_638 = local_638 + 1) {
        for (local_63c = 0; local_63c < local_628; local_63c = local_63c + 1) {
          local_24c = local_638 * in_stack_00000010;
          local_248 = &local_620;
          local_648 = (long)local_660 +
                      (long)(local_63c * in_stack_00000008) * 4 +
                      (long)local_f4 * (long)local_24c * local_110;
          local_64c = *(float *)(local_588 + (long)(local_638 * local_628 + local_63c) * 4);
          for (local_650 = 0; local_650 < local_530; local_650 = local_650 + 1) {
            local_654 = *(float *)(local_5d8 + (long)local_650 * 4);
            *(float *)(local_648 + (long)local_568[local_650] * 4) =
                 local_64c * local_654 + *(float *)(local_648 + (long)local_568[local_650] * 4);
          }
        }
      }
      local_4a0 = &local_620;
      local_664 = local_630 * local_634;
      local_420 = local_4f8;
      local_268 = local_270;
      local_108 = local_660;
      local_98 = local_588;
      local_620 = local_660;
      local_610 = local_110;
      local_608 = local_114;
      local_600 = local_120;
      local_5f4 = local_f4;
      local_5f0 = local_f8;
      local_5e8 = local_fc;
      local_5b0 = local_b0;
      for (local_668 = 0; local_668 < local_664; local_668 = local_668 + 1) {
        local_7f4 = (float)local_660[local_668];
        local_190 = in_stack_00000038;
        local_184[0] = local_7f4;
        switch(in_stack_00000030) {
        case 1:
          if (local_7f4 <= 0.0) {
            local_184[0] = 0.0;
          }
          break;
        case 2:
          local_138 = in_stack_00000038;
          local_140 = 0;
          local_194 = *(float *)*in_stack_00000038;
          if (local_7f4 <= 0.0) {
            local_7f4 = local_7f4 * local_194;
          }
          local_184[0] = local_7f4;
          break;
        case 3:
          local_148 = in_stack_00000038;
          local_150 = 0;
          local_198 = *(float *)*in_stack_00000038;
          local_158 = in_stack_00000038;
          local_160 = 1;
          local_19c = *(float *)(*in_stack_00000038 + 4);
          if (local_7f4 < local_198) {
            local_184[0] = local_198;
          }
          if (local_19c < local_184[0]) {
            local_184[0] = local_19c;
          }
          break;
        case 4:
          local_1a0 = 88.37626;
          pfVar2 = std::min<float>(local_184,&local_1a0);
          local_184[0] = *pfVar2;
          local_1a4 = -88.37626;
          pfVar2 = std::max<float>(local_184,&local_1a4);
          local_184[0] = *pfVar2;
          fVar5 = expf(-local_184[0]);
          local_184[0] = 1.0 / (fVar5 + 1.0);
          break;
        case 5:
          fVar5 = expf(local_7f4);
          fVar5 = logf(fVar5 + 1.0);
          local_184[0] = tanhf(fVar5);
          local_184[0] = local_7f4 * local_184[0];
          break;
        case 6:
          local_168 = in_stack_00000038;
          local_170 = 0;
          local_1a8 = *(float *)*in_stack_00000038;
          local_178 = in_stack_00000038;
          local_184[1] = 1.4013e-45;
          local_184[2] = 0.0;
          local_1ac = *(float *)(*in_stack_00000038 + 4);
          local_1b0 = -local_1ac / local_1a8;
          local_1b4 = 1.0 / local_1a8 + local_1b0;
          if (local_1b0 <= local_7f4) {
            if (local_7f4 <= local_1b4) {
              local_184[0] = local_7f4 * (local_7f4 * local_1a8 + local_1ac);
            }
          }
          else {
            local_184[0] = 0.0;
          }
        }
        local_660[local_668] = local_184[0];
      }
      local_4e8 = &local_620;
      local_440 = local_4e8;
      if (local_618 != (int *)0x0) {
        local_444 = 0xffffffff;
        LOCK();
        local_448 = *local_618;
        *local_618 = *local_618 + -1;
        UNLOCK();
        if (local_448 == 1) {
          if (local_600 == (long *)0x0) {
            local_408 = local_620;
            if (local_620 != (undefined4 *)0x0) {
              free(local_620);
            }
          }
          else {
            (**(code **)(*local_600 + 0x18))(local_600,local_620);
          }
        }
      }
      local_620 = (undefined4 *)0x0;
      local_610 = 0;
      local_608 = 0;
      local_5f8 = 0;
      local_5f4 = 0;
      local_5f0 = 0;
      local_5ec = 0;
      local_5e8 = 0;
      local_5e0 = 0;
      local_618 = (int *)0x0;
    }
  }
  else {
    local_66c = local_524 / in_stack_00000028;
    local_670 = local_52c / in_stack_00000028;
    for (local_674 = 0; local_674 < in_stack_00000028; local_674 = local_674 + 1) {
      for (local_678 = 0; local_678 < local_670; local_678 = local_678 + 1) {
        local_33c = local_674 * local_670 + local_678;
        local_330 = &local_6c0;
        local_bc = *(int *)((long)local_508 + 0x2c);
        local_c0 = (int)local_508[6];
        local_c4 = *(int *)((long)local_508 + 0x34);
        puVar3 = (undefined4 *)(*local_508 + local_508[8] * (long)local_33c * local_508[2]);
        local_d8 = local_508[2];
        local_dc = (undefined4)local_508[3];
        local_e8 = (long *)local_508[4];
        local_b8 = &local_6c0;
        local_6b8 = (int *)0x0;
        local_68c = 1;
        local_18 = (long)local_bc * (long)local_c0 * local_d8;
        local_680 = (local_18 + 0xfU & 0xfffffffffffffff0) / local_d8;
        local_698 = (int)local_508[5] + -1;
        if ((int)local_508[5] == 4) {
          local_680 = (long)*(int *)((long)local_508 + 0x2c) * (long)(int)local_508[6];
        }
        local_1c = 0x10;
        local_33d = 1;
        local_358 = local_510;
        local_6c8 = *local_510 + (long)(local_530 * local_66c * local_670 * local_674) * 4;
        local_4b8 = local_518;
        bVar4 = true;
        if (*local_518 != 0) {
          local_3d0 = local_518;
          bVar4 = local_518[8] * (long)(int)local_518[7] == 0;
        }
        if (bVar4) {
          local_840 = 0;
        }
        else {
          local_2d0 = (long)(local_674 * local_670 + local_678);
          local_2c8 = local_518;
          local_840 = *(undefined4 *)(*local_518 + local_2d0 * 4);
        }
        local_6cc = local_840;
        local_298 = &local_6c0;
        local_29c = local_840;
        local_2a0 = (int)local_680 * local_c4;
        local_2a8 = puVar3;
        for (local_2ac = 0; local_2ac < local_2a0; local_2ac = local_2ac + 1) {
          *local_2a8 = local_840;
          local_2a8 = local_2a8 + 1;
        }
        local_6d0 = *(int *)((long)local_500 + 0x2c);
        local_6d4 = (int)local_500[6];
        local_6d8 = *(int *)((long)local_508 + 0x2c);
        local_6dc = (int)local_508[6];
        for (local_6e0 = 0; local_6e0 < local_6d4; local_6e0 = local_6e0 + 1) {
          for (local_6e4 = 0; local_6e4 < local_6d0; local_6e4 = local_6e4 + 1) {
            local_25c = local_6e0 * in_stack_00000010;
            local_258 = &local_6c0;
            local_6f0 = (long)puVar3 +
                        (long)(local_6e4 * in_stack_00000008) * 4 +
                        (long)local_bc * (long)local_25c * local_d8;
            local_6f8 = local_6c8 + (long)(local_530 * local_66c * local_678) * 4;
            for (local_6fc = 0; local_6fc < local_66c; local_6fc = local_6fc + 1) {
              local_3c4 = local_66c * local_674 + local_6fc;
              local_3b8 = &local_748;
              local_4c = *(int *)((long)local_500 + 0x2c);
              local_50 = (int)local_500[6];
              local_54 = *(undefined4 *)((long)local_500 + 0x34);
              local_60 = *local_500 + local_500[8] * (long)local_3c4 * local_500[2];
              local_68 = local_500[2];
              local_6c = (undefined4)local_500[3];
              local_78 = local_500[4];
              local_48 = &local_748;
              local_38 = (long)local_4c * (long)local_50 * local_68;
              local_3c = 0x10;
              local_3c5 = 1;
              local_128 = &local_748;
              local_12c = local_6e0;
              local_700 = *(float *)(local_60 + (long)local_4c * (long)local_6e0 * local_68 +
                                    (long)local_6e4 * 4);
              local_4d8 = &local_748;
              local_748 = 0;
              local_738 = 0;
              local_730 = 0;
              local_720 = 0;
              local_71c = 0;
              local_718 = 0;
              local_714 = 0;
              local_710 = 0;
              local_708 = 0;
              local_740 = 0;
              for (local_74c = 0; local_74c < local_530; local_74c = local_74c + 1) {
                *(float *)(local_6f0 + (long)local_568[local_74c] * 4) =
                     local_700 * *(float *)(local_6f8 + (long)local_74c * 4) +
                     *(float *)(local_6f0 + (long)local_568[local_74c] * 4);
              }
              local_6f8 = local_6f8 + (long)local_530 * 4;
              local_460 = local_4d8;
              local_728 = local_78;
            }
          }
        }
        local_4a8 = &local_6c0;
        iVar1 = local_6d8 * local_6dc;
        local_290 = local_298;
        local_d0 = puVar3;
        local_6c0 = puVar3;
        local_6b0 = local_d8;
        local_6a8 = local_dc;
        local_6a0 = local_e8;
        local_694 = local_bc;
        local_690 = local_c0;
        local_688 = local_c4;
        for (local_760 = 0; local_760 < iVar1; local_760 = local_760 + 1) {
          local_894 = (float)puVar3[local_760];
          local_218 = in_stack_00000038;
          in_stack_fffffffffffff770 = (allocator_type *)(ulong)(in_stack_00000030 - 1);
          local_20c[0] = local_894;
          switch(in_stack_fffffffffffff770) {
          case (allocator_type *)0x0:
            if (local_894 <= 0.0) {
              local_20c[0] = 0.0;
            }
            break;
          case (allocator_type *)0x1:
            local_1c0 = in_stack_00000038;
            local_1c8 = 0;
            local_21c = *(float *)*in_stack_00000038;
            if (local_894 <= 0.0) {
              local_894 = local_894 * local_21c;
            }
            local_20c[0] = local_894;
            break;
          case (allocator_type *)0x2:
            local_1d0 = in_stack_00000038;
            local_1d8 = 0;
            local_220 = *(float *)*in_stack_00000038;
            local_1e0 = in_stack_00000038;
            local_1e8 = 1;
            local_224 = *(float *)(*in_stack_00000038 + 4);
            if (local_894 < local_220) {
              local_20c[0] = local_220;
            }
            if (local_224 < local_20c[0]) {
              local_20c[0] = local_224;
            }
            break;
          case (allocator_type *)0x3:
            local_228 = 88.37626;
            pfVar2 = std::min<float>(local_20c,&local_228);
            local_20c[0] = *pfVar2;
            local_22c = -88.37626;
            pfVar2 = std::max<float>(local_20c,&local_22c);
            local_20c[0] = *pfVar2;
            fVar5 = expf(-local_20c[0]);
            local_20c[0] = 1.0 / (fVar5 + 1.0);
            break;
          case (allocator_type *)0x4:
            fVar5 = expf(local_894);
            fVar5 = logf(fVar5 + 1.0);
            local_20c[0] = tanhf(fVar5);
            local_20c[0] = local_894 * local_20c[0];
            break;
          case (allocator_type *)0x5:
            local_1f0 = in_stack_00000038;
            local_1f8 = 0;
            local_230 = *(float *)*in_stack_00000038;
            local_200 = in_stack_00000038;
            local_20c[1] = 1.4013e-45;
            local_20c[2] = 0.0;
            local_234 = *(float *)(*in_stack_00000038 + 4);
            local_238 = -local_234 / local_230;
            local_23c = 1.0 / local_230 + local_238;
            if (local_238 <= local_894) {
              if (local_894 <= local_23c) {
                local_20c[0] = local_894 * (local_894 * local_230 + local_234);
              }
            }
            else {
              local_20c[0] = 0.0;
            }
          }
          puVar3[local_760] = local_20c[0];
        }
        local_4c8 = &local_6c0;
        local_480 = local_4c8;
        if (local_6b8 != (int *)0x0) {
          local_484 = 0xffffffff;
          LOCK();
          local_488 = *local_6b8;
          *local_6b8 = *local_6b8 + -1;
          UNLOCK();
          if (local_488 == 1) {
            if (local_6a0 == (long *)0x0) {
              local_3e8 = local_6c0;
              if (local_6c0 != (undefined4 *)0x0) {
                free(local_6c0);
              }
            }
            else {
              (**(code **)(*local_6a0 + 0x18))(local_6a0,local_6c0);
            }
          }
        }
        local_6c0 = (undefined4 *)0x0;
        local_6b0 = 0;
        local_6a8 = 0;
        local_698 = 0;
        local_694 = 0;
        local_690 = 0;
        local_68c = 0;
        local_688 = 0;
        local_680 = 0;
        local_6b8 = (int *)0x0;
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff770);
  return 0;
}

Assistant:

static int deconvolutiondepthwise(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (inch == group && group == outch)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat out = top_blob.channel(g);

            const float bias = bias_data.empty() ? 0.f : bias_data[g];

            out.fill(bias);

            // shadowed variable for less openmp task args
            const int w = bottom_blob.w;
            const int h = bottom_blob.h;
            const int outw = top_blob.w;
            const int outh = top_blob.h;

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = out.row(i * stride_h) + j * stride_w;

                    const float val = inptr[i * w + j];

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }
                }
            }

            {
                float* outptr = out;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                }
            }
        }
    }
    else
    {
        const int inch_g = inch / group;
        const int outch_g = outch / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outch_g; p++)
            {
                Mat out = top_blob.channel(g * outch_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * inch_g * outch_g * g;

                const float bias = bias_data.empty() ? 0.f : bias_data[g * outch_g + p];

                out.fill(bias);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int outw = top_blob.w;
                const int outh = top_blob.h;

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i * stride_h) + j * stride_w;

                        const float* kptr = weight_data_ptr + maxk * inch_g * p;

                        for (int q = 0; q < inch_g; q++)
                        {
                            const float val = bottom_blob.channel(inch_g * g + q).row(i)[j];

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[space_ofs[k]] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                    }
                }
            }
        }
    }

    return 0;
}